

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

char * bc_shell_quote(char *command)

{
  bc_string_t *str;
  size_t sVar1;
  char *pcVar2;
  ulong local_20;
  size_t i;
  bc_string_t *rv;
  char *command_local;
  
  str = bc_string_new();
  bc_string_append_c(str,'\'');
  if (command != (char *)0x0) {
    for (local_20 = 0; sVar1 = strlen(command), local_20 < sVar1; local_20 = local_20 + 1) {
      if (command[local_20] == '!') {
        bc_string_append(str,"\'\\!\'");
      }
      else if (command[local_20] == '\'') {
        bc_string_append(str,"\'\\\'\'");
      }
      else {
        bc_string_append_c(str,command[local_20]);
      }
    }
  }
  bc_string_append_c(str,'\'');
  pcVar2 = bc_string_free(str,false);
  return pcVar2;
}

Assistant:

char*
bc_shell_quote(const char *command)
{
    bc_string_t *rv = bc_string_new();
    bc_string_append_c(rv, '\'');
    if (command != NULL) {
        for (size_t i = 0; i < strlen(command); i++) {
            switch (command[i]) {
                case '!':
                    bc_string_append(rv, "'\\!'");
                    break;
                case '\'':
                    bc_string_append(rv, "'\\''");
                    break;
                default:
                    bc_string_append_c(rv, command[i]);
            }
        }
    }
    bc_string_append_c(rv, '\'');
    return bc_string_free(rv, false);
}